

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O3

void * sysbvm_jit_getTrampolineOrEntryPointForBytecode
                 (sysbvm_bytecodeJit_t *jit,sysbvm_functionBytecode_t *bytecode)

{
  sysbvm_context_t *psVar1;
  _Bool _Var2;
  ulong uVar3;
  uint8_t *trampolineExecutablePointer;
  uint8_t *trampolineWritePointer;
  void *local_30;
  undefined4 *local_28;
  
  uVar3 = bytecode->jittedCode;
  psVar1 = jit->context;
  if (((uVar3 == 0) || (bytecode->jittedCodeSessionToken != (psVar1->roots).sessionToken)) &&
     ((uVar3 = bytecode->jittedCodeTrampoline, uVar3 == 0 ||
      (bytecode->jittedCodeTrampolineSessionToken != (psVar1->roots).sessionToken)))) {
    local_28 = (undefined4 *)0x0;
    local_30 = (void *)0x0;
    sysbvm_chunkedAllocator_allocateWithDualMapping
              (&(psVar1->heap).codeAllocator,0x10,0x10,&local_28,&local_30);
    _Var2 = sysbvm_virtualMemory_lockCodePagesForWriting(local_28,local_30,0x10);
    if (!_Var2) {
      abort();
    }
    *local_28 = 0xfa1e0ff3;
    *(undefined2 *)(local_28 + 1) = 0xb848;
    *(undefined1 *)((long)local_28 + 6) = 0xb9;
    *(undefined1 *)((long)local_28 + 7) = 0xbb;
    *(undefined1 *)(local_28 + 2) = 0x14;
    *(undefined1 *)((long)local_28 + 9) = 0;
    *(undefined1 *)((long)local_28 + 10) = 0;
    *(undefined1 *)((long)local_28 + 0xb) = 0;
    *(undefined1 *)(local_28 + 3) = 0;
    *(undefined1 *)((long)local_28 + 0xd) = 0;
    *(undefined2 *)((long)local_28 + 0xe) = 0xe0ff;
    sysbvm_virtualMemory_unlockCodePagesForExecution(local_28,local_30,0x10);
    if ((long)local_30 + 0x800000000000000U >> 0x3c == 0) {
      uVar3 = (long)local_30 << 4 | 0xc;
    }
    else {
      uVar3 = sysbvm_tuple_int64_encodeBig(jit->context,(int64_t)local_30);
    }
    bytecode->jittedCodeTrampoline = uVar3;
    if (local_28 + 0x200000000000000 < (undefined4 *)0x1000000000000000) {
      uVar3 = (long)local_28 << 4 | 0xc;
    }
    else {
      uVar3 = sysbvm_tuple_int64_encodeBig(jit->context,(int64_t)local_28);
    }
    bytecode->jittedCodeTrampolineWritePointer = uVar3;
    bytecode->jittedCodeTrampolineSessionToken = (jit->context->roots).sessionToken;
  }
  else if ((uVar3 & 0xf) == 0) {
    local_30 = *(void **)(uVar3 + 0x10);
  }
  else {
    local_30 = (void *)((long)uVar3 >> 4);
  }
  return local_30;
}

Assistant:

static void *sysbvm_jit_getTrampolineOrEntryPointForBytecode(sysbvm_bytecodeJit_t *jit, sysbvm_functionBytecode_t *bytecode)
{
    // Attempt direct entry first.
    if(bytecode->jittedCode && bytecode->jittedCodeSessionToken == jit->context->roots.sessionToken)
        return (void*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCode);

    if(bytecode->jittedCodeTrampoline && bytecode->jittedCodeTrampolineSessionToken == jit->context->roots.sessionToken)
        return (void*)sysbvm_tuple_systemHandle_decode(bytecode->jittedCodeTrampoline);

    uint64_t trampolineTargetAddress = (uint64_t)(uintptr_t)&sysbvm_bytecodeInterpreter_applyJitTrampolineDestination;

    uint8_t trampolineCode[] = {
        // Endbr64
        0xF3, 0x0F, 0x1E, 0xFA,

        // Mov64
        sysbvm_jit_x86_rex(true, false, false, false),
        0xB8 + SYSBVM_X86_RAX,
        trampolineTargetAddress & 0xFF, (trampolineTargetAddress >> 8) & 0xFF, (trampolineTargetAddress >> 16) & 0xFF, (trampolineTargetAddress >> 24) & 0xFF,
        (trampolineTargetAddress >> 32) & 0xFF, (trampolineTargetAddress >> 40) & 0xFF, (trampolineTargetAddress >> 48) & 0xFF, (trampolineTargetAddress >> 56) & 0xFF,

        // Jmp RAX
        0xFF,
        sysbvm_jit_x86_modRMRegister(SYSBVM_X86_RAX, 4),
    };

    // Install the trampoline in the code zone.
    size_t trampolineCodeSize = sizeof(trampolineCode);
    size_t requiredCodeSize = sysbvm_sizeAlignedTo(trampolineCodeSize, 16);

    uint8_t *trampolineWritePointer = NULL;
    uint8_t *trampolineExecutablePointer = NULL;
    sysbvm_chunkedAllocator_allocateWithDualMapping(&jit->context->heap.codeAllocator, requiredCodeSize, 16, (void**)&trampolineWritePointer, (void**)&trampolineExecutablePointer);
    if(!sysbvm_virtualMemory_lockCodePagesForWriting(trampolineWritePointer, trampolineExecutablePointer, requiredCodeSize))
        abort();

    memset(trampolineWritePointer, 0xcc, requiredCodeSize); // int3;
    memcpy(trampolineWritePointer, trampolineCode, trampolineCodeSize);

    sysbvm_virtualMemory_unlockCodePagesForExecution(trampolineWritePointer, trampolineExecutablePointer, requiredCodeSize);

    bytecode->jittedCodeTrampoline = sysbvm_tuple_systemHandle_encode(jit->context, (sysbvm_systemHandle_t)(uintptr_t)trampolineExecutablePointer);
    bytecode->jittedCodeTrampolineWritePointer = sysbvm_tuple_systemHandle_encode(jit->context, (sysbvm_systemHandle_t)(uintptr_t)trampolineWritePointer);
    bytecode->jittedCodeTrampolineSessionToken = jit->context->roots.sessionToken;

    return trampolineExecutablePointer;
}